

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void * duckdb_je_base_alloc_rtree(tsdn_t *tsdn,base_t *base,size_t size)

{
  void *pvVar1;
  size_t *in_RSI;
  size_t *in_RDI;
  size_t unaff_retaddr;
  void *rtree;
  size_t usize;
  long local_28;
  size_t in_stack_fffffffffffffff8;
  
  pvVar1 = base_alloc_impl((tsdn_t *)usize,(base_t *)rtree,unaff_retaddr,in_stack_fffffffffffffff8,
                           in_RDI,in_RSI);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    in_RSI[0x1e9] = local_28 + in_RSI[0x1e9];
  }
  return pvVar1;
}

Assistant:

void *
base_alloc_rtree(tsdn_t *tsdn, base_t *base, size_t size) {
	size_t usize;
	void *rtree = base_alloc_impl(tsdn, base, size, CACHELINE, NULL,
	    &usize);
	if (rtree == NULL) {
		return NULL;
	}
	if (config_stats) {
		base->rtree_allocated += usize;
	}
	return rtree;
}